

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Args.cpp
# Opt level: O2

bool idx2::OptVal(int NArgs,cstr *Args,cstr Opt,array<idx2::stref> *Vals)

{
  char *__s;
  long lVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  long lVar5;
  i32 J;
  long lVar6;
  long lVar7;
  cstr Temp;
  
  lVar7 = 2;
  while( true ) {
    if ((long)NArgs <= lVar7 + -1) {
      return false;
    }
    iVar2 = strncmp(Args[lVar7 + -1],Opt,0x20);
    lVar6 = lVar7;
    if (iVar2 == 0) break;
    lVar7 = lVar7 + 1;
  }
  for (; (uVar3 = NArgs, (int)(uint)lVar6 < NArgs &&
         (__s = Args[lVar6], uVar3 = (uint)lVar6, *__s != '-')); lVar6 = lVar6 + 1) {
    sVar4 = strlen(__s);
    lVar5 = *(long *)(Vals + 0x18);
    if (*(long *)(Vals + 0x20) <= lVar5) {
      GrowCapacity<idx2::stref>(Vals,0);
      lVar5 = *(long *)(Vals + 0x18);
    }
    *(long *)(Vals + 0x18) = lVar5 + 1;
    lVar1 = *(long *)Vals;
    *(char **)(lVar1 + lVar5 * 0x10) = __s;
    *(int *)(lVar1 + 8 + lVar5 * 0x10) = (int)sVar4;
  }
  return (uint)lVar7 < uVar3;
}

Assistant:

bool
OptVal(int NArgs, cstr* Args, cstr Opt, array<stref>* Vals)
{
  for (i32 I = 1; I < NArgs; ++I)
  {
    if (strncmp(Args[I], Opt, 32) == 0)
    {
      i32 J = I + 1;
      while (J < NArgs && Args[J][0] != '-')
      {
        cstr Temp;
        Temp = Args[J];
        stref Str = stref(Temp);
        PushBack(Vals, Str);
        ++J;
      }
      return J > I + 1;
    }
  }
  return false;
}